

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall spectest::JSONParser::ParseTypeObject(JSONParser *this,Type *out_type)

{
  Result RVar1;
  Enum EVar2;
  
  RVar1 = Expect(this,"{");
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = ExpectKey(this,"type");
    if (RVar1.enum_ != Error) {
      RVar1 = ParseType(this,out_type);
      if (RVar1.enum_ != Error) {
        RVar1 = Expect(this,"}");
        EVar2 = (Enum)(RVar1.enum_ == Error);
      }
    }
  }
  return (Result)EVar2;
}

Assistant:

wabt::Result JSONParser::ParseTypeObject(Type* out_type) {
  EXPECT("{");
  EXPECT_KEY("type");
  CHECK_RESULT(ParseType(out_type));
  EXPECT("}");
  return wabt::Result::Ok;
}